

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvm.cpp
# Opt level: O3

Value * Kvm::peekCharProc(Kvm *vm,Value *args)

{
  char cVar1;
  Value *pVVar2;
  _func_int **pp_Var3;
  
  if (vm->NIL == args) {
    pp_Var3 = (_func_int **)&std::cin;
  }
  else {
    pp_Var3 = args[1]._vptr_Value;
  }
  cVar1 = std::istream::peek();
  if ((*(byte *)((long)pp_Var3 + *(long *)(*pp_Var3 + -0x18) + 0x20) & 5) == 0) {
    pVVar2 = (Value *)(long)(cVar1 * 4 + 2);
  }
  else {
    pVVar2 = vm->EOFOBJ;
  }
  return pVVar2;
}

Assistant:

const Value* Kvm::peekCharProc(Kvm *vm, const Value *args)
{
    const InputPort *ip = static_cast<const InputPort *>(args);
    std::istream &stream = args == vm->NIL ? std::cin : *ip->input;
    auto result = stream.peek();
    return stream ? vm->makeChar(result) : vm->EOFOBJ;
}